

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O1

pollwrapper * pollwrap_new(void)

{
  pollwrapper *ppVar1;
  pollfd *ppVar2;
  tree234 *ptVar3;
  
  ppVar1 = (pollwrapper *)safemalloc(1,0x20,0);
  ppVar1->fdsize = 0x10;
  ppVar1->nfd = 0;
  ppVar2 = (pollfd *)safemalloc(0x10,8,0);
  ppVar1->fds = ppVar2;
  ptVar3 = newtree234(pollwrap_fd_cmp);
  ppVar1->fdtopos = ptVar3;
  return ppVar1;
}

Assistant:

pollwrapper *pollwrap_new(void)
{
    pollwrapper *pw = snew(pollwrapper);
    pw->fdsize = 16;
    pw->nfd = 0;
    pw->fds = snewn(pw->fdsize, struct pollfd);
    pw->fdtopos = newtree234(pollwrap_fd_cmp);
    return pw;
}